

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void issue316(void)

{
  roaring_bitmap_t *r;
  roaring_bitmap_t *file;
  roaring_bitmap_t *prVar1;
  roaring_bitmap_t *rb3;
  roaring_bitmap_t *rb2;
  roaring_bitmap_t *rb1;
  roaring_bitmap_t *in_stack_00000020;
  roaring_bitmap_t *in_stack_00000028;
  roaring_bitmap_t *in_stack_00000048;
  roaring_bitmap_t *in_stack_00000050;
  uint64_t in_stack_ffffffffffffffe8;
  int iVar2;
  roaring_bitmap_t *in_stack_fffffffffffffff0;
  
  r = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(r,true);
  roaring_bitmap_add_range(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,0x10bdd1);
  iVar2 = (int)(in_stack_ffffffffffffffe8 >> 0x20);
  file = roaring_bitmap_create();
  roaring_bitmap_or_inplace(in_stack_00000050,in_stack_00000048);
  roaring_bitmap_is_subset(in_stack_00000028,in_stack_00000020);
  _assert_true((unsigned_long)rb3,(char *)r,(char *)file,iVar2);
  roaring_bitmap_is_subset(in_stack_00000028,in_stack_00000020);
  _assert_true((unsigned_long)rb3,(char *)r,(char *)file,iVar2);
  roaring_bitmap_equals(rb2,rb3);
  _assert_true((unsigned_long)rb3,(char *)r,(char *)file,iVar2);
  prVar1 = roaring_bitmap_copy(rb2);
  iVar2 = (int)((ulong)prVar1 >> 0x20);
  roaring_bitmap_is_subset(in_stack_00000028,in_stack_00000020);
  _assert_true((unsigned_long)rb3,(char *)r,(char *)file,iVar2);
  roaring_bitmap_is_subset(in_stack_00000028,in_stack_00000020);
  _assert_true((unsigned_long)rb3,(char *)r,(char *)file,iVar2);
  roaring_bitmap_equals(rb2,rb3);
  _assert_true((unsigned_long)rb3,(char *)r,(char *)file,iVar2);
  roaring_bitmap_equals(rb2,rb3);
  _assert_true((unsigned_long)rb3,(char *)r,(char *)file,iVar2);
  roaring_bitmap_free((roaring_bitmap_t *)0x10bf41);
  roaring_bitmap_free((roaring_bitmap_t *)0x10bf4b);
  roaring_bitmap_free((roaring_bitmap_t *)0x10bf54);
  return;
}

Assistant:

DEFINE_TEST(issue316) {
    roaring_bitmap_t *rb1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(rb1, true);
    roaring_bitmap_add_range(rb1, 1, 100);
    roaring_bitmap_t *rb2 = roaring_bitmap_create();
    roaring_bitmap_or_inplace(rb2, rb1);
    assert_true(roaring_bitmap_is_subset(rb2, rb1));
    assert_true(roaring_bitmap_is_subset(rb1, rb2));
    assert_true(roaring_bitmap_equals(rb1, rb2));
    roaring_bitmap_t *rb3 = roaring_bitmap_copy(rb2);
    assert_true(roaring_bitmap_is_subset(rb3, rb1));
    assert_true(roaring_bitmap_is_subset(rb1, rb3));
    assert_true(roaring_bitmap_equals(rb1, rb3));
    assert_true(roaring_bitmap_equals(rb1, rb2));
    roaring_bitmap_free(rb1);
    roaring_bitmap_free(rb2);
    roaring_bitmap_free(rb3);
}